

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall
libtorrent::dht::node::get_item
          (node *this,public_key *pk,string *salt,
          function<void_(const_libtorrent::dht::item_&,_bool)> *f)

{
  uint uVar1;
  element_type *peVar2;
  function<void_(const_libtorrent::dht::item_&,_bool)> *out;
  span<const_char> in;
  function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
  local_b8;
  undefined1 local_98 [8];
  shared_ptr<libtorrent::dht::get_item> ta;
  undefined8 local_80;
  undefined1 local_78 [8];
  char hex_key [65];
  function<void_(const_libtorrent::dht::item_&,_bool)> *f_local;
  string *salt_local;
  public_key *pk_local;
  node *this_local;
  
  if ((this->m_observer != (dht_observer *)0x0) &&
     (out = f, uVar1 = (**(this->m_observer->super_dht_logger)._vptr_dht_logger)(this->m_observer,1)
     , (uVar1 & 1) != 0)) {
    span<char_const>::span<std::array<char,32ul>,char,void>
              ((span<char_const> *)
               &ta.super___shared_ptr<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&pk->bytes);
    in.m_len = (difference_type)local_78;
    in.m_ptr = (char *)local_80;
    libtorrent::aux::to_hex
              ((aux *)ta.super___shared_ptr<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi,in,(char *)out);
    (*(this->m_observer->super_dht_logger)._vptr_dht_logger[1])
              (this->m_observer,1,"starting get for [ key: %s ]",local_78);
  }
  ::std::
  function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
  ::function(&local_b8);
  ::std::
  make_shared<libtorrent::dht::get_item,libtorrent::dht::node&,libtorrent::dht::public_key_const&,std::__cxx11::string_const&,std::function<void(libtorrent::dht::item_const&,bool)>,std::function<void(std::vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>const&)>>
            ((node *)local_98,(public_key *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pk,
             (function<void_(const_libtorrent::dht::item_&,_bool)> *)salt,
             (function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
              *)f);
  ::std::
  function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
  ::~function(&local_b8);
  peVar2 = ::std::
           __shared_ptr_access<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_98);
  (*(peVar2->super_find_data).super_traversal_algorithm._vptr_traversal_algorithm[3])();
  ::std::shared_ptr<libtorrent::dht::get_item>::~shared_ptr
            ((shared_ptr<libtorrent::dht::get_item> *)local_98);
  return;
}

Assistant:

void node::get_item(public_key const& pk, std::string const& salt
	, std::function<void(item const&, bool)> f)
{
#ifndef TORRENT_DISABLE_LOGGING
	if (m_observer != nullptr && m_observer->should_log(dht_logger::node))
	{
		char hex_key[65];
		aux::to_hex(pk.bytes, hex_key);
		m_observer->log(dht_logger::node, "starting get for [ key: %s ]", hex_key);
	}
#endif

	auto ta = std::make_shared<dht::get_item>(*this, pk, salt, std::move(f)
		, find_data::nodes_callback());
	ta->start();
}